

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

char * Qiniu_escape(char *s,escapeMode mode,Qiniu_Bool *fesc)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  Qiniu_Bool QVar7;
  long lVar8;
  int iVar9;
  size_t sVar10;
  bool bVar11;
  
  sVar4 = strlen(s);
  if (sVar4 == 0) {
    bVar11 = true;
    iVar3 = 0;
  }
  else {
    iVar9 = 0;
    sVar10 = 0;
    iVar3 = 0;
    do {
      bVar1 = s[sVar10];
      iVar2 = Qiniu_shouldEscape((uint)bVar1,mode);
      if (iVar2 != 0) {
        if (bVar1 == 0x20 && mode == encodeQueryComponent) {
          iVar9 = iVar9 + 1;
        }
        else {
          iVar3 = iVar3 + 1;
        }
      }
      sVar10 = sVar10 + 1;
    } while (sVar4 != sVar10);
    bVar11 = iVar9 == 0;
  }
  QVar7 = 0;
  if (!(bool)(bVar11 & iVar3 == 0)) {
    pcVar5 = (char *)malloc(sVar4 + (long)(iVar3 * 2) + 1);
    lVar8 = 0;
    if (sVar4 != 0) {
      sVar10 = 0;
      do {
        bVar1 = s[sVar10];
        iVar3 = Qiniu_shouldEscape((uint)bVar1,mode);
        if (iVar3 == 0) {
          pcVar5[lVar8] = bVar1;
LAB_0010da89:
          lVar6 = 1;
        }
        else {
          if (bVar1 == 0x20 && mode == encodeQueryComponent) {
            pcVar5[lVar8] = '+';
            goto LAB_0010da89;
          }
          pcVar5[lVar8] = '%';
          pcVar5[lVar8 + 1] = "0123456789ABCDEF"[bVar1 >> 4];
          pcVar5[lVar8 + 2] = "0123456789ABCDEF"[bVar1 & 0xf];
          lVar6 = 3;
        }
        lVar8 = lVar8 + lVar6;
        sVar10 = sVar10 + 1;
      } while (sVar4 != sVar10);
    }
    pcVar5[lVar8] = '\0';
    QVar7 = 1;
    s = pcVar5;
  }
  *fesc = QVar7;
  return s;
}

Assistant:

static char *Qiniu_escape(const char *s, escapeMode mode, Qiniu_Bool *fesc)
{
	int spaceCount = 0;
	int hexCount = 0;
	size_t i, j, len = strlen(s);
	int c;
	char *t;

	for (i = 0; i < len; i++)
	{
		// prevent c from sign extension
		c = ((int)s[i]) & 0xFF;
		if (Qiniu_shouldEscape(c, mode))
		{
			if (c == ' ' && mode == encodeQueryComponent)
			{
				spaceCount++;
			}
			else
			{
				hexCount++;
			}
		}
	}

	if (spaceCount == 0 && hexCount == 0)
	{
		*fesc = Qiniu_False;
		return (char *)s;
	}

	t = (char *)malloc(len + 2 * hexCount + 1);
	j = 0;
	for (i = 0; i < len; i++)
	{
		// prevent c from sign extension
		c = ((int)s[i]) & 0xFF;
		if (Qiniu_shouldEscape(c, mode))
		{
			if (c == ' ' && mode == encodeQueryComponent)
			{
				t[j] = '+';
				j++;
			}
			else
			{
				t[j] = '%';
				t[j + 1] = Qiniu_hexTable[c >> 4];
				t[j + 2] = Qiniu_hexTable[c & 15];
				j += 3;
			}
		}
		else
		{
			t[j] = s[i];
			j++;
		}
	}
	t[j] = '\0';
	*fesc = Qiniu_True;
	return t;
}